

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O3

_Bool run_container_is_subset_bitset(run_container_t *container1,bitset_container_t *container2)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar2 = container2->cardinality;
  if (iVar2 == -1) {
    iVar2 = bitset_container_compute_cardinality(container2);
  }
  iVar3 = run_container_cardinality(container1);
  if (iVar2 < iVar3) {
LAB_0012cf21:
    _Var1 = false;
  }
  else {
    _Var1 = true;
    if (0 < (long)container1->n_runs) {
      lVar4 = 0;
      do {
        uVar5 = (ulong)container1->runs[lVar4].value;
        iVar2 = container1->runs[lVar4].length + 1;
        do {
          if ((*(ulong *)((long)container2->words + (ulong)((uint)(uVar5 >> 3) & 0x1ff8)) >>
               (uVar5 & 0x3f) & 1) == 0) goto LAB_0012cf21;
          uVar5 = (ulong)((int)uVar5 + 1);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != container1->n_runs);
    }
  }
  return _Var1;
}

Assistant:

bool run_container_is_subset_bitset(const run_container_t* container1,
                                    const bitset_container_t* container2) {
    // todo: this code could be much faster
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < run_container_cardinality(container1)) {
            return false;
        }
    } else {
        int32_t card = bitset_container_compute_cardinality(
            container2);  // modify container2?
        if (card < run_container_cardinality(container1)) {
            return false;
        }
    }
    for (int i = 0; i < container1->n_runs; ++i) {
        uint32_t run_start = container1->runs[i].value;
        uint32_t le = container1->runs[i].length;
        for (uint32_t j = run_start; j <= run_start + le; ++j) {
            if (!bitset_container_contains(container2, j)) {
                return false;
            }
        }
    }
    return true;
}